

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  pointer pbVar2;
  cmTargetExport *name;
  char *destination;
  char *file_permissions;
  char *component;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  MessageLevel MVar6;
  ostream *poVar7;
  string *psVar8;
  long lVar9;
  cmGlobalGenerator *pcVar10;
  cmTarget *this_00;
  undefined4 extraout_var;
  cmInstallExportGenerator *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  pointer ppcVar11;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  bool exportOld;
  string fname;
  string local_3e8;
  pointer local_3c8;
  cmExportSet *local_3c0;
  string exp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string filename;
  string name_space;
  string local_328;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  ios_base local_298 [264];
  cmInstallCommandArguments ica;
  
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space._M_string_length = 0;
  name_space.field_2._M_local_buf[0] = '\0';
  exportOld = false;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  name_00.super_string_view._M_str = "EXPORT";
  name_00.super_string_view._M_len = 6;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name_00,&exp)
  ;
  name_01.super_string_view._M_str = "NAMESPACE";
  name_01.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_01,&name_space);
  name_02.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_02.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_02,&exportOld);
  name_03.super_string_view._M_str = "FILE";
  name_03.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_03,&filename);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&ica.super_cmArgumentParser<void>,args,&unknownArgs,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar3) {
      psVar8 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar8->_M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," given no DESTINATION!",0x16);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&fname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname._M_dataplus._M_p != &fname.field_2) {
          operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00271847;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename._M_dataplus._M_p,
                 filename._M_dataplus._M_p + filename._M_string_length);
      lVar9 = std::__cxx11::string::find_first_of((char *)&fname,0x54f098,0);
      if (lVar9 == -1) {
        if (fname._M_string_length != 0) {
          cmsys::SystemTools::GetFilenameLastExtension((string *)&e,&fname);
          iVar4 = std::__cxx11::string::compare((char *)&e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_2f8) {
            operator_delete(_e,local_2f8[0]._M_allocated_capacity + 1);
          }
          if (iVar4 == 0) {
            if (fname._M_string_length == 0) goto LAB_00271c0b;
            goto LAB_00271d2c;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," given invalid export file name \"",0x21);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,fname._M_dataplus._M_p,fname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"The FILE argument must specify a name ending in \".cmake\".",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_3e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002719a8;
        }
LAB_00271c0b:
        std::__cxx11::string::_M_assign((string *)&fname);
        std::__cxx11::string::append((char *)&fname);
        lVar9 = std::__cxx11::string::find_first_of((char *)&fname,0x54f098,0);
        if (lVar9 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," given export name \"",0x14);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,exp._M_dataplus._M_p,exp._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"This name cannot be safely converted to a file name.  ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"Specify a different export name or use the FILE option to set ",0x3e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"a file name explicitly.",0x17);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_3e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002719a8;
        }
LAB_00271d2c:
        pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        local_3c0 = cmExportSetMap::operator[](&pcVar10->ExportSets,&exp);
        if (exportOld == true) {
          ppcVar11 = (local_3c0->TargetExports).
                     super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          local_3c8 = (local_3c0->TargetExports).
                      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if (ppcVar11 != local_3c8) {
            do {
              name = *ppcVar11;
              pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
              this_00 = cmGlobalGenerator::FindTarget(pcVar10,&name->TargetName,false);
              if (((this_00 == (cmTarget *)0x0) ||
                  (PVar5 = cmTarget::GetPolicyStatus(this_00,CMP0022), PVar5 == WARN)) ||
                 (PVar5 = cmTarget::GetPolicyStatus(this_00,CMP0022), PVar5 == OLD)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&e,"INSTALL(EXPORT) given keyword \"",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&e,"EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&e,"\", but target \"",0xf);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&e,(name->TargetName)._M_dataplus._M_p,
                                    (name->TargetName)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" does not have policy CMP0022 set to NEW.",0x2a);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_3e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p,
                                  local_3e8.field_2._M_allocated_capacity + 1);
                }
                goto LAB_002719a8;
              }
              ppcVar11 = ppcVar11 + 1;
            } while (ppcVar11 != local_3c8);
          }
        }
        MVar6 = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
        local_3c8 = (pointer)CONCAT44(extraout_var,MVar6);
        this_01 = (cmInstallExportGenerator *)operator_new(0x178);
        psVar8 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        destination = (psVar8->_M_dataplus)._M_p;
        psVar8 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        file_permissions = (psVar8->_M_dataplus)._M_p;
        configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        component = (psVar8->_M_dataplus)._M_p;
        bVar3 = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        cmInstallExportGenerator::cmInstallExportGenerator
                  (this_01,local_3c0,destination,file_permissions,configurations,component,
                   (MessageLevel)local_3c8,bVar3,fname._M_dataplus._M_p,name_space._M_dataplus._M_p,
                   exportOld,false);
        bVar3 = true;
        cmMakefile::AddInstallGenerator
                  ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_01);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," given invalid export file name \"",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,fname._M_dataplus._M_p,fname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"The FILE argument may not contain a path.  ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"Specify the path in the DESTINATION argument.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
LAB_002719a8:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_298);
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002719eb;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," given unknown argument \"",0x19);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,((unknownArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&fname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
LAB_00271847:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_298);
  }
  bVar3 = false;
LAB_002719eb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                             filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space._M_dataplus._M_p != &name_space.field_2) {
    operator_delete(name_space._M_dataplus._M_p,
                    CONCAT71(name_space.field_2._M_allocated_capacity._1_7_,
                             name_space.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p,
                    CONCAT71(exp.field_2._M_allocated_capacity._1_7_,exp.field_2._M_local_buf[0]) +
                    1);
  }
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar3;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = exp;
    fname += ".cmake";

    if (fname.find_first_of(":/\\") != std::string::npos) {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
    }
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp];
  if (exportOld) {
    for (cmTargetExport* te : *exportSet->GetTargetExports()) {
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES"
          << "\", but target \"" << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.c_str(), exportOld,
    false);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}